

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

void __thiscall draco::EntryValue::EntryValue<double>(EntryValue *this,double *data)

{
  reference pvVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t data_type_size;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1c2c74);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_RSI,8);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_RDI,0);
  *(pointer *)pvVar1 =
       (in_RSI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  return;
}

Assistant:

explicit EntryValue(const DataTypeT &data) {
    const size_t data_type_size = sizeof(DataTypeT);
    data_.resize(data_type_size);
    memcpy(&data_[0], &data, data_type_size);
  }